

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O0

void __thiscall lf::mesh::hybrid2d::MeshFactory::PrintLists(MeshFactory *this,ostream *o)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  pointer pGVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  int local_84;
  ulong uStack_80;
  int l;
  size_t j_2;
  size_t j_1;
  Matrix<double,_0,_1,_0,_0,_1> local_59;
  Matrix<double,__1,__1,_0,__1,__1> local_58;
  Matrix<double,__1,__1,_0,__1,__1> local_40;
  non_const_type local_28;
  ulong local_20;
  size_t j;
  ostream *o_local;
  MeshFactory *this_local;
  
  j = (size_t)o;
  o_local = (ostream *)this;
  poVar4 = std::operator<<(o,"hybrid2d::MeshFactory: Internal information");
  std::operator<<(poVar4,'\n');
  sVar2 = j;
  sVar5 = std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::size(&this->nodes_);
  poVar4 = (ostream *)std::ostream::operator<<((void *)sVar2,sVar5);
  poVar4 = std::operator<<(poVar4," nodes:");
  std::operator<<(poVar4,'\n');
  for (local_20 = 0; uVar1 = local_20,
      sVar5 = std::
              vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
              ::size(&this->nodes_), sVar2 = j, uVar1 < sVar5; local_20 = local_20 + 1) {
    poVar4 = std::operator<<((ostream *)j,"Node ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    std::operator<<(poVar4," at ");
    pvVar6 = std::
             vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
             ::operator[](&this->nodes_,local_20);
    bVar3 = std::operator==(pvVar6,(nullptr_t)0x0);
    sVar2 = j;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      poVar4 = std::operator<<((ostream *)j,"with unknown location!");
      std::operator<<(poVar4,'\n');
    }
    else {
      pvVar6 = std::
               vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
               ::operator[](&this->nodes_,local_20);
      pGVar7 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
               ::operator->(pvVar6);
      Eigen::Matrix<double,_0,_1,_0,_0,_1>::Matrix(&local_59);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,0,1,0,0,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_58,
                 (EigenBase<Eigen::Matrix<double,_0,_1,_0,_0,_1>_> *)&local_59);
      (*pGVar7->_vptr_Geometry[3])(&local_40,pGVar7,(Matrix<double,_1,_1,0,_1,_1> *)&local_58);
      local_28 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_40);
      poVar4 = Eigen::operator<<((ostream *)sVar2,
                                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  *)&local_28);
      std::operator<<(poVar4,'\n');
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_40);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_58);
    }
  }
  sVar5 = std::
          vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
          ::size(&this->edges_);
  poVar4 = (ostream *)std::ostream::operator<<((void *)sVar2,sVar5);
  poVar4 = std::operator<<(poVar4," edges ");
  std::operator<<(poVar4,'\n');
  for (j_2 = 0; sVar5 = std::
                        vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                        ::size(&this->edges_), j_2 < sVar5; j_2 = j_2 + 1) {
    poVar4 = std::operator<<((ostream *)j,"Edge ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,j_2);
    poVar4 = std::operator<<(poVar4,": ");
    pvVar8 = std::
             vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
             ::operator[](&this->edges_,j_2);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](&pvVar8->first,0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar9);
    poVar4 = std::operator<<(poVar4," <-> ");
    pvVar8 = std::
             vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
             ::operator[](&this->edges_,j_2);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](&pvVar8->first,1);
    std::ostream::operator<<(poVar4,*pvVar9);
    pvVar8 = std::
             vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
             ::operator[](&this->edges_,j_2);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pvVar8->second);
    if (bVar3) {
      std::operator<<((ostream *)j," with geometry");
    }
    std::operator<<((ostream *)j,'\n');
  }
  sVar5 = std::
          vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
          ::size(&this->elements_);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,sVar5);
  poVar4 = std::operator<<(poVar4," cells ");
  std::operator<<(poVar4,'\n');
  for (uStack_80 = 0;
      sVar5 = std::
              vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
              ::size(&this->elements_), uStack_80 < sVar5; uStack_80 = uStack_80 + 1) {
    poVar4 = std::operator<<((ostream *)j,"Cell ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_80);
    std::operator<<(poVar4," : ");
    for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
      pvVar10 = std::
                vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                ::operator[](&this->elements_,uStack_80);
      pvVar11 = std::array<unsigned_int,_4UL>::operator[](&pvVar10->first,(long)local_84);
      sVar2 = j;
      if (*pvVar11 != 0xffffffff) {
        pvVar10 = std::
                  vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
                  ::operator[](&this->elements_,uStack_80);
        pvVar11 = std::array<unsigned_int,_4UL>::operator[](&pvVar10->first,(long)local_84);
        poVar4 = (ostream *)std::ostream::operator<<((void *)sVar2,*pvVar11);
        std::operator<<(poVar4," ");
      }
    }
    pvVar10 = std::
              vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
              ::operator[](&this->elements_,uStack_80);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pvVar10->second);
    if (bVar3) {
      std::operator<<((ostream *)j," with geometry");
    }
    else {
      std::operator<<((ostream *)j,"[no geometry]");
    }
    std::operator<<((ostream *)j,'\n');
  }
  return;
}

Assistant:

void MeshFactory::PrintLists(std::ostream& o) const {
  o << "hybrid2d::MeshFactory: Internal information" << '\n';
  o << nodes_.size() << " nodes:" << '\n';
  for (std::size_t j = 0; j < nodes_.size(); j++) {
    o << "Node " << j << " at ";
    if (nodes_[j] != nullptr) {
      o << (nodes_[j]->Global(Eigen::Matrix<double, 0, 1>())).transpose()
        << '\n';
    } else {
      o << "with unknown location!" << '\n';
    }
  }
  o << edges_.size() << " edges " << '\n';
  for (std::size_t j = 0; j < edges_.size(); j++) {
    o << "Edge " << j << ": " << edges_[j].first[0] << " <-> "
      << edges_[j].first[1];
    if (edges_[j].second) {
      o << " with geometry";
    }
    o << '\n';
  }

  std::cout << elements_.size() << " cells " << '\n';
  for (std::size_t j = 0; j < elements_.size(); j++) {
    o << "Cell " << j << " : ";
    for (int l = 0; l < 4; l++) {
      if (elements_[j].first[l] != static_cast<size_type>(-1)) {
        o << elements_[j].first[l] << " ";
      }
    }
    if (elements_[j].second) {
      o << " with geometry";
    } else {
      o << "[no geometry]";
    }
    o << '\n';
  }
}